

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *psVar6;
  FieldDescriptor *field;
  FieldGenerator *p;
  ulong uVar7;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *local_68;
  int local_30;
  int i;
  Options *options_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap *this_local;
  
  this->descriptor_ = descriptor;
  this->options_ = options;
  iVar2 = Descriptor::field_count(descriptor);
  uVar3 = (ulong)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  psVar6 = (scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_68 = psVar6;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::scoped_ptr
                (local_68,(FieldGenerator *)0x0);
      local_68 = local_68 + 1;
    } while (local_68 != psVar6 + uVar3);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
  ::scoped_array(&this->field_generators_,psVar6);
  local_30 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= local_30) break;
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
             ::operator[](&this->field_generators_,(long)local_30);
    field = Descriptor::field(descriptor,local_30);
    p = MakeGenerator(field,options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::reset(psVar6,p);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      options_(options),
      field_generators_(
          new google::protobuf::scoped_ptr<FieldGenerator>[descriptor->field_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(MakeGenerator(descriptor->field(i), options));
  }
}